

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall QFutureInterfaceBase::cleanContinuation(QFutureInterfaceBase *this)

{
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->d != (QFutureInterfaceBasePrivate *)0x0) {
    local_28._0_8_ = &this->d->continuationMutex;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBasicMutex::lock((QBasicMutex *)local_28._0_8_);
    local_28[8] = true;
    std::function<void_(const_QFutureInterfaceBase_&)>::operator=
              (&this->d->continuation,(nullptr_t)0x0);
    LOCK();
    (this->d->continuationState)._M_i = Cleaned;
    UNLOCK();
    this->d->continuationData = (QFutureInterfaceBasePrivate *)0x0;
    QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::cleanContinuation()
{
    if (!d)
        return;

    QMutexLocker lock(&d->continuationMutex);
    d->continuation = nullptr;
    d->continuationState = QFutureInterfaceBasePrivate::Cleaned;
    d->continuationData = nullptr;
}